

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitHop.c
# Opt level: O0

Hop_Obj_t * Kit_GraphToHop(Hop_Man_t *pMan,Kit_Graph_t *pGraph)

{
  Kit_Node_t *pKVar1;
  Hop_Obj_t *pHVar2;
  int local_24;
  int i;
  Kit_Node_t *pNode;
  Kit_Graph_t *pGraph_local;
  Hop_Man_t *pMan_local;
  
  for (local_24 = 0; local_24 < pGraph->nLeaves; local_24 = local_24 + 1) {
    pKVar1 = Kit_GraphNode(pGraph,local_24);
    pHVar2 = Hop_IthVar(pMan,local_24);
    (pKVar1->field_2).pFunc = pHVar2;
  }
  pHVar2 = Kit_GraphToHopInternal(pMan,pGraph);
  return pHVar2;
}

Assistant:

Hop_Obj_t * Kit_GraphToHop( Hop_Man_t * pMan, Kit_Graph_t * pGraph )
{
    Kit_Node_t * pNode = NULL;
    int i;
    // collect the fanins
    Kit_GraphForEachLeaf( pGraph, pNode, i )
        pNode->pFunc = Hop_IthVar( pMan, i );
    // perform strashing
    return Kit_GraphToHopInternal( pMan, pGraph );
}